

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_make_sized(size_t nw)

{
  mp_int *x_00;
  mp_int *x;
  size_t nw_local;
  
  x_00 = (mp_int *)safemalloc(1,0x10,nw << 3);
  if (nw != 0) {
    x_00->nw = nw;
    x_00->w = &x_00[1].nw;
    mp_clear(x_00);
    return x_00;
  }
  __assert_fail("nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x48,"mp_int *mp_make_sized(size_t)");
}

Assistant:

mp_int *mp_make_sized(size_t nw)
{
    mp_int *x = snew_plus(mp_int, nw * sizeof(BignumInt));
    assert(nw);                   /* we outlaw the zero-word mp_int */
    x->nw = nw;
    x->w = snew_plus_get_aux(x);
    mp_clear(x);
    return x;
}